

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::CommissionerSafe::PanIdQuery
          (Error *__return_storage_ptr__,CommissionerSafe *this,uint32_t aChannelMask,
          uint16_t aPanId,string *aDstAddr)

{
  undefined6 in_register_0000000a;
  promise<ot::commissioner::Error> pro;
  __basic_future<ot::commissioner::Error> _Stack_78;
  promise<ot::commissioner::Error> local_68;
  promise<ot::commissioner::Error> *local_50;
  undefined8 local_48;
  code *local_40;
  code *local_38;
  
  std::promise<ot::commissioner::Error>::promise(&local_68);
  local_48 = 0;
  local_38 = std::
             _Function_handler<void_(ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:496:32)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_safe.cpp:496:32)>
             ::_M_manager;
  local_50 = &local_68;
  (*(this->super_Commissioner)._vptr_Commissioner[0x2d])
            (this,&local_50,(ulong)aChannelMask,CONCAT62(in_register_0000000a,aPanId) & 0xffffffff,
             aDstAddr);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,3);
  }
  std::__basic_future<ot::commissioner::Error>::__basic_future(&_Stack_78,&local_68._M_future);
  std::future<ot::commissioner::Error>::get
            (__return_storage_ptr__,(future<ot::commissioner::Error> *)&_Stack_78);
  if (_Stack_78._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (_Stack_78._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::promise<ot::commissioner::Error>::~promise(&local_68);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerSafe::PanIdQuery(uint32_t aChannelMask, uint16_t aPanId, const std::string &aDstAddr)
{
    std::promise<Error> pro;
    auto                wait = [&pro](Error error) { pro.set_value(error); };

    PanIdQuery(wait, aChannelMask, aPanId, aDstAddr);
    return pro.get_future().get();
}